

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O1

int __thiscall QTreeViewPrivate::lastVisibleItem(QTreeViewPrivate *this,int firstVisual,int offset)

{
  int iVar1;
  int iVar2;
  QWidgetData *pQVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  long in_FS_OFFSET;
  int local_2c;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_2c = offset;
  if ((offset | firstVisual) < 0) {
    firstVisual = firstVisibleItem(this,&local_2c);
    if (firstVisual < 0) {
      uVar6 = 0xffffffff;
      goto LAB_005b4190;
    }
  }
  uVar6 = (ulong)(uint)firstVisual;
  if (uVar6 < (ulong)(this->viewItems).d.size) {
    pQVar3 = ((this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.viewport)->
             data;
    iVar1 = (pQVar3->crect).y2.m_i;
    iVar2 = (pQVar3->crect).y1.m_i;
    iVar4 = -local_2c;
    do {
      iVar5 = itemHeight(this,(int)uVar6);
      iVar4 = iVar5 + iVar4;
      if ((iVar1 - iVar2) + 1 < iVar4) goto LAB_005b4190;
      uVar6 = uVar6 + 1;
    } while (uVar6 < (ulong)(this->viewItems).d.size);
  }
  uVar6 = (ulong)((int)(this->viewItems).d.size - 1);
LAB_005b4190:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (int)uVar6;
  }
  __stack_chk_fail();
}

Assistant:

int QTreeViewPrivate::lastVisibleItem(int firstVisual, int offset) const
{
    if (firstVisual < 0 || offset < 0) {
        firstVisual = firstVisibleItem(&offset);
        if (firstVisual < 0)
            return -1;
    }
    int y = - offset;
    int value = viewport->height();

    for (int i = firstVisual; i < viewItems.size(); ++i) {
        y += itemHeight(i); // the height value is cached
        if (y > value)
            return i;
    }
    return viewItems.size() - 1;
}